

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

HighsCDouble __thiscall
HighsLp::objectiveCDoubleValue(HighsLp *this,vector<double,_std::allocator<double>_> *solution)

{
  HighsCDouble *in_RSI;
  int *in_RDI;
  HighsInt iCol;
  HighsCDouble objective_function_value;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  HighsCDouble local_10;
  
  HighsCDouble::HighsCDouble(&local_10,*(double *)(in_RDI + 0x3e));
  for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)iVar1);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)in_RSI,(long)iVar1);
    HighsCDouble::operator+=(in_RSI,(double)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  }
  return local_10;
}

Assistant:

HighsCDouble HighsLp::objectiveCDoubleValue(
    const std::vector<double>& solution) const {
  assert((int)solution.size() >= this->num_col_);
  HighsCDouble objective_function_value = this->offset_;
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
    objective_function_value += this->col_cost_[iCol] * solution[iCol];
  return objective_function_value;
}